

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool trans_ADD_zzi(DisasContext_conflict1 *s,arg_rri_esz *a)

{
  uint vece;
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t dofs;
  uint32_t aofs;
  uint vsz;
  TCGContext_conflict1 *tcg_ctx;
  arg_rri_esz *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if ((a->esz == 0) && (uVar2 = extract32(s->insn,0xd,1), uVar2 != 0)) {
    s_local._7_1_ = false;
  }
  else {
    _Var1 = sve_access_check_aarch64(s);
    if (_Var1) {
      uVar2 = vec_full_reg_size(s);
      vece = a->esz;
      dofs = vec_full_reg_offset(s,a->rd);
      aofs = vec_full_reg_offset(s,a->rn);
      tcg_gen_gvec_addi_aarch64(tcg_ctx_00,vece,dofs,aofs,(long)a->imm,uVar2,uVar2);
    }
    s_local._7_1_ = true;
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_ADD_zzi(DisasContext *s, arg_rri_esz *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (a->esz == 0 && extract32(s->insn, 13, 1)) {
        return false;
    }
    if (sve_access_check(s)) {
        unsigned vsz = vec_full_reg_size(s);
        tcg_gen_gvec_addi(tcg_ctx, a->esz, vec_full_reg_offset(s, a->rd),
                          vec_full_reg_offset(s, a->rn), a->imm, vsz, vsz);
    }
    return true;
}